

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall rw::Matrix::optimize(Matrix *this,Tolerance *tolerance)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  Tolerance *pTVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  
  pTVar4 = (Tolerance *)&matrixDefaultTolerance;
  if (tolerance != (Tolerance *)0x0) {
    pTVar4 = tolerance;
  }
  fVar5 = normalError(this);
  fVar1 = (float)pTVar4->normal;
  fVar6 = orthogonalError(this);
  fVar2 = (float)pTVar4->orthogonal;
  uVar3 = 0;
  if (((float)fVar5 <= fVar1) && (uVar3 = 0, (float)fVar6 <= fVar2)) {
    fVar7 = identityError(this);
    uVar3 = (uint)((float)fVar7 <= (float)pTVar4->identity) << 0x11;
  }
  this->flags = ((uint)((float)fVar5 <= fVar1) | this->flags & 0xfffdfffc) +
                (uint)((float)fVar6 <= fVar2) * 2 | uVar3;
  return;
}

Assistant:

void
Matrix::optimize(Tolerance *tolerance)
{
	bool32 isnormal, isorthogonal, isidentity;
	if(tolerance == nil)
		tolerance = &matrixDefaultTolerance;
	isnormal = normalError() <= tolerance->normal;
	isorthogonal = orthogonalError() <= tolerance->orthogonal;
	isidentity = isnormal && isorthogonal && identityError() <= tolerance->identity;
	if(isnormal)
		flags |= TYPENORMAL;
	else
		flags &= ~TYPENORMAL;
	if(isorthogonal)
		flags |= TYPEORTHOGONAL;
	else
		flags &= ~TYPEORTHOGONAL;
	if(isidentity)
		flags |= IDENTITY;
	else
		flags &= ~IDENTITY;
}